

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  bool bVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool local_82;
  FilePath *this_local;
  FilePath local_50;
  undefined1 local_30 [8];
  FilePath parent;
  
  parent.pathname_.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  bVar1 = IsDirectory(this);
  if (bVar1) {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 == 0) || (bVar1 = DirectoryExists(this), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      RemoveTrailingPathSeparator(&local_50,this);
      RemoveFileName((FilePath *)local_30,&local_50);
      ~FilePath(&local_50);
      bVar1 = CreateDirectoriesRecursively((FilePath *)local_30);
      local_82 = false;
      if (bVar1) {
        local_82 = CreateFolder(this);
      }
      this_local._7_1_ = local_82;
      ~FilePath((FilePath *)local_30);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != parent.pathname_.field_2._8_8_) {
    __stack_chk_fail();
  }
  return this_local._7_1_;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}